

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int64_t GetPos(GmfMshSct *msh)

{
  long in_RDI;
  int64_t pos;
  int IntVal;
  void *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if (*(int *)(in_RDI + 4) < 3) {
    ScaWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
           in_stack_ffffffffffffffe8);
    in_stack_ffffffffffffffe8 = (void *)(long)in_stack_fffffffffffffff4;
  }
  else {
    ScaDblWrd((GmfMshSct *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
              in_stack_ffffffffffffffe8);
  }
  return (int64_t)in_stack_ffffffffffffffe8;
}

Assistant:

static int64_t GetPos(GmfMshSct *msh)
{
   int      IntVal;
   int64_t  pos;

   if(msh->ver >= 3)
      ScaDblWrd(msh, (unsigned char*)&pos);
   else
   {
      ScaWrd(msh, (unsigned char*)&IntVal);
      pos = (int64_t)IntVal;
   }

   return(pos);
}